

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

CodeDescriptor * __thiscall
FastVector<BinaryCache::CodeDescriptor,_false,_false>::push_back
          (FastVector<BinaryCache::CodeDescriptor,_false,_false> *this)

{
  FastVector<BinaryCache::CodeDescriptor,_false,_false> *this_local;
  
  if (this->count == this->max) {
    grow(this,this->count);
  }
  this->count = this->count + 1;
  return this->data + (this->count - 1);
}

Assistant:

T* push_back()
	{
		if(count == max)
			grow(count);

		count++;

		return &data[count - 1];
	}